

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-getnameinfo.c
# Opt level: O0

void getnameinfo_req(uv_getnameinfo_t *handle,int status,char *hostname,char *service)

{
  char *service_local;
  char *hostname_local;
  int status_local;
  uv_getnameinfo_t *handle_local;
  
  if (handle == (uv_getnameinfo_t *)0x0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-getnameinfo.c"
            ,0x29,"handle != NULL");
    abort();
  }
  if (status != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-getnameinfo.c"
            ,0x2a,"status == 0");
    abort();
  }
  if (hostname == (char *)0x0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-getnameinfo.c"
            ,0x2b,"hostname != NULL");
    abort();
  }
  if (service == (char *)0x0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-getnameinfo.c"
            ,0x2c,"service != NULL");
    abort();
  }
  return;
}

Assistant:

static void getnameinfo_req(uv_getnameinfo_t* handle,
                            int status,
                            const char* hostname,
                            const char* service) {
  ASSERT(handle != NULL);
  ASSERT(status == 0);
  ASSERT(hostname != NULL);
  ASSERT(service != NULL);
}